

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.h
# Opt level: O0

bool __thiscall sing::HttpRequest::keepAlive(HttpRequest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  byte local_c2;
  allocator<char> local_a9;
  string local_a8;
  string local_88;
  byte local_65;
  bool res;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [8];
  string connection;
  HttpRequest *this_local;
  
  connection.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Connection",&local_51);
  getHeaders((string *)local_30,this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30,"Keep-Alive");
  local_c2 = 1;
  if (!bVar4) {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,"keep-alive");
    local_c2 = 1;
    if (!bVar4) {
      if (this->version == HTTP11) {
        bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_30,"close");
        local_c2 = 1;
        if (bVar4) goto LAB_0013570a;
      }
      std::allocator<char>::allocator();
      bVar3 = true;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Keep-Alive",&local_a9)
      ;
      bVar2 = true;
      getHeaders(&local_88,this,&local_a8);
      bVar1 = true;
      local_c2 = std::__cxx11::string::empty();
      local_c2 = local_c2 ^ 0xff;
    }
  }
LAB_0013570a:
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_88);
  }
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if (bVar3) {
    std::allocator<char>::~allocator(&local_a9);
  }
  local_65 = local_c2 & 1;
  std::__cxx11::string::~string((string *)local_30);
  return (bool)(local_c2 & 1);
}

Assistant:

bool keepAlive() const{
        std::string connection = getHeaders("Connection");
        bool res = (connection == "Keep-Alive" || connection == "keep-alive") 
            || (version == HTTP11 && connection != "close") 
            || (!getHeaders("Keep-Alive").empty());

        return res;
    }